

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaxi.c
# Opt level: O2

Gia_Man_t * Gia_ManMaxiUnfold(Gia_Man_t *p,int nFrames,int fUseVars,Vec_Int_t *vInit)

{
  ulong uVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *p_01;
  size_t sVar9;
  char *__dest;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  int iVar16;
  
  p_01 = Gia_ManStart(p->nObjs * nFrames + p->nRegs * fUseVars * 2);
  pcVar15 = p->pName;
  iVar16 = 0;
  if (pcVar15 == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar15);
    __dest = (char *)malloc(sVar9 + 1);
    strcpy(__dest,pcVar15);
  }
  p_01->pName = __dest;
  Gia_ManHashAlloc(p_01);
  p->pObjs->Value = 0;
  while ((iVar16 < p->nRegs &&
         (pGVar10 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16), pGVar10 != (Gia_Obj_t *)0x0))
        ) {
    Gia_ManAppendCi(p_01);
    iVar16 = iVar16 + 1;
  }
  iVar16 = 0;
  while ((iVar16 < p->nRegs &&
         (pGVar10 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16), pGVar10 != (Gia_Obj_t *)0x0))
        ) {
    Gia_ManAppendCi(p_01);
    iVar16 = iVar16 + 1;
  }
  if ((vInit == (Vec_Int_t *)0x0) || (vInit->nSize == p->nRegs)) {
    iVar16 = 0;
    while ((iVar16 < p->nRegs &&
           (pGVar10 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar16), pGVar10 != (Gia_Obj_t *)0x0
           ))) {
      iVar2 = Vec_IntEntry(vInit,iVar16);
      iVar3 = Gia_ManCiLit(p_01,iVar16);
      iVar4 = Gia_ManCiLit(p_01,p->nRegs + iVar16);
      uVar5 = 0;
      uVar6 = 0;
      switch(iVar2) {
      case 0:
        if (fUseVars != 0) {
          uVar5 = Gia_ManHashAnd(p_01,iVar3,iVar4);
        }
        goto LAB_004ae7ad;
      case 1:
        uVar5 = 1;
        if (fUseVars != 0) {
          iVar2 = Abc_LitNot(iVar3);
          uVar5 = Gia_ManHashOr(p_01,iVar2,iVar4);
        }
        goto LAB_004ae7ad;
      case 2:
        uVar6 = Gia_ManHashAnd(p_01,iVar3,iVar4);
        break;
      case 3:
        iVar2 = Abc_LitNot(iVar3);
        uVar6 = Gia_ManHashOr(p_01,iVar2,iVar4);
        break;
      case 4:
        break;
      case 5:
        uVar6 = 1;
        break;
      default:
        pcVar15 = "0";
        uVar6 = 0x67;
        goto LAB_004aeb88;
      }
      uVar5 = uVar6;
LAB_004ae7ad:
      pGVar10->Value = uVar5;
      iVar16 = iVar16 + 1;
    }
    iVar2 = 0;
    iVar16 = 0;
    if (0 < nFrames) {
      iVar16 = nFrames;
    }
    for (; iVar2 != iVar16; iVar2 = iVar2 + 1) {
      iVar3 = 0;
      while ((iVar3 < p->vCis->nSize - p->nRegs &&
             (pGVar10 = Gia_ManCi(p,iVar3), pGVar10 != (Gia_Obj_t *)0x0))) {
        uVar6 = Gia_ManAppendCi(p_01);
        pGVar10->Value = uVar6;
        iVar3 = iVar3 + 1;
      }
      iVar3 = 0;
      while ((iVar3 < p->nObjs && (pGVar10 = Gia_ManObj(p,iVar3), pGVar10 != (Gia_Obj_t *)0x0))) {
        if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) {
          iVar4 = Gia_ObjFanin0Copy(pGVar10);
          uVar6 = (uint)((ulong)*(undefined8 *)pGVar10 >> 0x20);
          iVar7 = Abc_LitNotCond(pGVar10[-(ulong)(uVar6 & 0x1fffffff)].Value,uVar6 >> 0x1d & 1);
          uVar6 = Gia_ManHashAnd(p_01,iVar4,iVar7);
          pGVar10->Value = uVar6;
        }
        iVar3 = iVar3 + 1;
      }
      iVar3 = 0;
      while ((iVar3 < p->nRegs &&
             (pGVar10 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar3),
             pGVar10 != (Gia_Obj_t *)0x0))) {
        uVar6 = Gia_ObjFanin0Copy(pGVar10);
        pGVar10->Value = uVar6;
        iVar3 = iVar3 + 1;
      }
      iVar3 = 0;
      while ((iVar3 < p->nRegs &&
             (pGVar10 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar3),
             pGVar10 != (Gia_Obj_t *)0x0))) {
        if (((uint)*(undefined8 *)pGVar10 & 0x9fffffff) != 0x9fffffff) {
LAB_004aeae2:
          __assert_fail("Gia_ObjIsRo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar7 = Gia_ObjCioId(pGVar10);
        iVar4 = p->vCis->nSize;
        if (iVar7 < iVar4 - p->nRegs) goto LAB_004aeae2;
        iVar7 = p->vCos->nSize;
        iVar8 = Gia_ObjCioId(pGVar10);
        pGVar11 = Gia_ManCo(p,(iVar7 - iVar4) + iVar8);
        pGVar10->Value = pGVar11->Value;
        iVar3 = iVar3 + 1;
      }
    }
    iVar16 = 0;
    while ((iVar16 < p->nRegs &&
           (pGVar10 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar16), pGVar10 != (Gia_Obj_t *)0x0
           ))) {
      uVar6 = pGVar10->Value;
      if (((int)uVar6 < 0) || (iVar2 = Abc_Lit2Var(uVar6), p_01->nObjs <= iVar2)) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      iVar2 = Abc_Lit2Var(uVar6);
      pGVar11 = Gia_ManObj(p_01,iVar2);
      if ((~*(uint *)pGVar11 & 0x1fffffff) != 0 && (int)*(uint *)pGVar11 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar11 = Gia_ManAppendObj(p_01);
      *(ulong *)pGVar11 = *(ulong *)pGVar11 | 0x80000000;
      iVar2 = Gia_ObjId(p_01,pGVar11);
      iVar3 = Abc_Lit2Var(uVar6);
      uVar14 = (ulong)(iVar2 - iVar3 & 0x1fffffff);
      uVar1 = *(ulong *)pGVar11;
      uVar13 = (ulong)((uVar6 & 1) << 0x1d);
      *(ulong *)pGVar11 = uVar13 | uVar1 & 0xffffffffc0000000 | uVar14;
      *(ulong *)pGVar11 =
           uVar13 | uVar1 & 0xe0000000c0000000 | uVar14 |
           (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
      p_00 = p_01->vCos;
      iVar2 = Gia_ObjId(p_01,pGVar11);
      Vec_IntPush(p_00,iVar2);
      if (p_01->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_01,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11)
        ;
      }
      iVar2 = Gia_ObjId(p_01,pGVar11);
      pGVar10->Value = iVar2 * 2;
      iVar16 = iVar16 + 1;
    }
    pGVar12 = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
    if (pGVar12->vCis->nSize - pGVar12->nRegs ==
        (p->vCis->nSize - p->nRegs) * nFrames + p->nRegs * 2) {
      return pGVar12;
    }
    pcVar15 = "Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p)";
    uVar6 = 0x78;
  }
  else {
    pcVar15 = "!vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p)";
    uVar6 = 0x54;
  }
LAB_004aeb88:
  __assert_fail(pcVar15,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaxi.c"
                ,uVar6,"Gia_Man_t *Gia_ManMaxiUnfold(Gia_Man_t *, int, int, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManMaxiUnfold( Gia_Man_t * p, int nFrames, int fUseVars, Vec_Int_t * vInit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, f;
    pNew = Gia_ManStart( fUseVars * 2 * Gia_ManRegNum(p) + nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    // control/data variables
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManAppendCi( pNew );
    // build timeframes
    assert( !vInit || Vec_IntSize(vInit) == Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        int Value = Vec_IntEntry( vInit, i );
        int iCtrl = Gia_ManCiLit( pNew, i );
        int iData = Gia_ManCiLit( pNew, Gia_ManRegNum(p)+i );
        // decide based on Value
        if ( Value == 0 )
            pObj->Value = fUseVars ? Gia_ManHashAnd(pNew, iCtrl, iData) : 0;
        else if ( Value == 1 )
            pObj->Value = fUseVars ? Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData) : 1;
        else if ( Value == 2 )
            pObj->Value = Gia_ManHashAnd(pNew, iCtrl, iData);
        else if ( Value == 3 )
            pObj->Value = Gia_ManHashOr(pNew, Abc_LitNot(iCtrl), iData);
        else if ( Value == 4 )
            pObj->Value = 0;
        else if ( Value == 5 )
            pObj->Value = 1;
        else assert( 0 );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRo( p, pObj, i )
            pObj->Value = Gia_ObjRoToRi(p, pObj)->Value;
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == 2 * Gia_ManRegNum(p) + nFrames * Gia_ManPiNum(p) );
    return pNew;
}